

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anna_hashmap.h
# Opt level: O2

pair<anna_hashmap<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
* __thiscall
anna_hashmap<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::insert(pair<anna_hashmap<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
         *__return_storage_ptr__,
        anna_hashmap<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this,pair<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *value)

{
  pointer puVar1;
  pointer pfVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  _Fwd_list_impl _Var8;
  pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pStack_58;
  
  lVar6 = (long)(this->table_).
                super__Vector_base<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::allocator<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->table_).
                super__Vector_base<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::allocator<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (10 < this->size_ / (ulong)(lVar6 >> 3)) {
    rehash(this,lVar6 >> 2);
  }
  sVar4 = anna_hash<std::array<int,_4UL>_>::hash(&value->first);
  pfVar2 = (this->table_).
           super__Vector_base<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::allocator<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar7 = 0;
  uVar5 = sVar4 % (ulong)((long)(this->table_).
                                super__Vector_base<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::allocator<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar2 >> 3) &
          0xffffffff;
  _Var8._M_head._M_next = (_Fwd_list_node_base)(pfVar2 + uVar5);
  do {
    _Var8._M_head._M_next =
         (_Fwd_list_node_base)((_Fwd_list_node_base *)_Var8._M_head._M_next)->_M_next;
    if ((_Fwd_list_impl)_Var8._M_head._M_next == (_Fwd_list_impl)0x0) {
      pfVar2 = (this->table_).
               super__Vector_base<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::allocator<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::
      pair<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                (&pStack_58,value);
      std::
      forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::push_front(pfVar2 + uVar5,&pStack_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pStack_58.second);
      this->size_ = this->size_ + 1;
      puVar1 = (this->bucket_sizes_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + uVar5;
      *puVar1 = *puVar1 + 1;
      bVar3 = true;
      sVar7 = 0;
LAB_0010c686:
      (__return_storage_ptr__->first).hashmap_ = this;
      (__return_storage_ptr__->first).bucket_ = uVar5;
      (__return_storage_ptr__->first).position_ = sVar7;
      __return_storage_ptr__->second = bVar3;
      return __return_storage_ptr__;
    }
    bVar3 = std::operator==((array<int,_4UL> *)((long)_Var8._M_head._M_next + 8),&value->first);
    if (bVar3) {
      bVar3 = false;
      goto LAB_0010c686;
    }
    sVar7 = sVar7 + 1;
  } while( true );
}

Assistant:

std::pair<iterator, bool> insert(const std::pair<K, V>& value) {
        if (size_ / table_.size() > MAX_AVERAGE_BUCKET_SIZE)
            rehash(2 * table_.size());

        const K& key = value.first;
        const unsigned bucket = anna_hash<K>::hash(key) % table_.size();

        int position = 0;
        for (const auto& kv : table_[bucket]) {
            if (kv.first == key) {
                return {iterator(this, bucket, position), false};
            }
            ++position;
        }

        table_[bucket].push_front(value);
        ++size_;
        ++bucket_sizes_[bucket];

        return {iterator(this, bucket, 0), true};
    }